

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  XmlWriter *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  ScopedElement local_50;
  uint local_3c;
  string stylesheetRef;
  
  LazyStat<Catch::TestRunInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestRunInfo,testInfo);
  (*(this->super_StreamingReporterBase<Catch::XmlReporter>).super_IStreamingReporter.
    _vptr_IStreamingReporter[0x12])(&stylesheetRef,this);
  if (stylesheetRef._M_string_length != 0) {
    XmlWriter::writeStylesheetRef(&this->m_xml,&stylesheetRef);
  }
  std::__cxx11::string::string((string *)&local_90,"Catch",(allocator *)&local_70);
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,&local_90,Newline|Indent);
  std::__cxx11::string::~string((string *)&local_90);
  (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_NonCopyable)._vptr_NonCopyable[4])(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (local_90._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_50);
    (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[4])(&local_70);
    XmlWriter::writeAttribute(this_00,&local_90,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    std::__cxx11::string::string((string *)&local_90,"filters",(allocator *)&local_50);
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters(&local_70,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar1));
    XmlWriter::writeAttribute(this_00,&local_90,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_90,"Randomness",&local_91);
    XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_00,(XmlFormatting)&local_90);
    std::__cxx11::string::string((string *)&local_70,"seed",&local_92);
    local_3c = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                   super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>(local_50.m_writer,&local_70,&local_3c);
    std::__cxx11::string::~string((string *)&local_70);
    XmlWriter::ScopedElement::~ScopedElement(&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&stylesheetRef);
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement( "Catch" );
        if( !m_config->name().empty() )
            m_xml.writeAttribute( "name", m_config->name() );
        if (m_config->testSpec().hasFilters())
            m_xml.writeAttribute( "filters", serializeFilters( m_config->getTestsOrTags() ) );
        if( m_config->rngSeed() != 0 )
            m_xml.scopedElement( "Randomness" )
                .writeAttribute( "seed", m_config->rngSeed() );
    }